

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapped_env.cpp
# Opt level: O0

void __thiscall
so_5::wrapped_env_t::wrapped_env_t
          (wrapped_env_t *this,generic_simple_init_t *init_func,
          generic_simple_so_env_params_tuner_t *params_tuner)

{
  function<void_(so_5::environment_params_t_&)> local_168;
  environment_params_t local_148;
  function<void_(so_5::environment_t_&)> local_40;
  generic_simple_so_env_params_tuner_t *local_20;
  generic_simple_so_env_params_tuner_t *params_tuner_local;
  generic_simple_init_t *init_func_local;
  wrapped_env_t *this_local;
  
  local_20 = params_tuner;
  params_tuner_local = (generic_simple_so_env_params_tuner_t *)init_func;
  init_func_local = (generic_simple_init_t *)this;
  std::function<void_(so_5::environment_t_&)>::function(&local_40,init_func);
  std::function<void_(so_5::environment_params_t_&)>::function(&local_168,params_tuner);
  anon_unknown_0::make_params_via_tuner(&local_148,&local_168);
  wrapped_env_t(this,&local_40,&local_148);
  environment_params_t::~environment_params_t(&local_148);
  std::function<void_(so_5::environment_params_t_&)>::~function(&local_168);
  std::function<void_(so_5::environment_t_&)>::~function(&local_40);
  return;
}

Assistant:

wrapped_env_t::wrapped_env_t(
	so_5::api::generic_simple_init_t init_func,
	so_5::api::generic_simple_so_env_params_tuner_t params_tuner )
	:	wrapped_env_t{
			std::move( init_func ),
			make_params_via_tuner( std::move( params_tuner ) ) }
	{}